

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O2

void heap_down(uchar *a,size_t i,size_t heap_size,size_t stride,
              _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uchar *pk1;
  uchar *pk2;
  
  do {
    if (heap_size >> 1 <= i) {
      return;
    }
    uVar3 = i * 2 + 1;
    if (heap_size <= uVar3) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/hsort_impl.h"
              ,0x35,"test condition failed: child1(i) < heap_size");
      abort();
    }
    uVar4 = i * 2 + 2;
    if (uVar4 < heap_size) {
      pk1 = a + uVar4 * 8;
      iVar2 = secp256k1_pubkey_sort_cmp(pk1,a + uVar3 * 8,(void *)stride);
      if (iVar2 < 0) goto LAB_00111445;
      pk2 = a + i * 8;
      iVar2 = secp256k1_pubkey_sort_cmp(pk1,pk2,(void *)stride);
      uVar3 = uVar4;
    }
    else {
LAB_00111445:
      pk1 = a + uVar3 * 8;
      pk2 = a + i * 8;
      iVar2 = secp256k1_pubkey_sort_cmp(pk1,pk2,(void *)stride);
    }
    if (iVar2 < 1) {
      return;
    }
    uVar1 = *(undefined8 *)pk2;
    *(undefined8 *)pk2 = *(undefined8 *)pk1;
    *(undefined8 *)pk1 = uVar1;
    i = uVar3;
  } while( true );
}

Assistant:

static SECP256K1_INLINE void heap_down(unsigned char *a, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at a[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (child2(i) < heap_size
                && 0 <= cmp(a + child2(i)*stride, a + child1(i)*stride, cmp_data)) {
            if (0 < cmp(a + child2(i)*stride, a +         i*stride, cmp_data)) {
                heap_swap(a, i, child2(i), stride);
                i = child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(a + child1(i)*stride, a +         i*stride, cmp_data)) {
            heap_swap(a, i, child1(i), stride);
            i = child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}